

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execution-results.h
# Opt level: O2

void __thiscall wasm::ExecutionResults::get(ExecutionResults *this,Module *wasm)

{
  LoggingExternalInterface *this_00;
  ModuleRunner **this_01;
  pointer puVar1;
  Export *pEVar2;
  ostream *poVar3;
  Function *func;
  _Copy_assign_base<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
  *this_02;
  pointer puVar4;
  variant<wasm::Name,_wasm::HeapType> *pvVar5;
  Literal *pLVar6;
  long lVar7;
  long lVar8;
  Name NVar9;
  Iterator IVar10;
  Name name;
  Name name_00;
  undefined1 local_428 [8];
  ModuleRunner instance;
  LoggingExternalInterface interface;
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  local_e8;
  undefined1 local_b0 [8];
  value_type value;
  FunctionResult ret;
  
  this_00 = (LoggingExternalInterface *)
            &instance.super_ModuleRunnerBase<wasm::ModuleRunner>.linkedInstances._M_t._M_impl.
             super__Rb_tree_header._M_node_count;
  LoggingExternalInterface::LoggingExternalInterface(this_00,&this->loggings,wasm);
  local_e8._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_e8._M_impl.super__Rb_tree_header._M_header;
  local_e8._M_impl._0_8_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_e8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_e8._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_e8._M_impl.super__Rb_tree_header._M_header._M_right =
       local_e8._M_impl.super__Rb_tree_header._M_header._M_left;
  ModuleRunner::ModuleRunner
            ((ModuleRunner *)local_428,wasm,(ExternalInterface *)this_00,
             (map<wasm::Name,_std::shared_ptr<wasm::ModuleRunner>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
              *)&local_e8);
  std::
  _Rb_tree<wasm::Name,_std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>,_std::_Select1st<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::shared_ptr<wasm::ModuleRunner>_>_>_>
  ::~_Rb_tree(&local_e8);
  instance.super_ModuleRunnerBase<wasm::ModuleRunner>.super_ExpressionRunner<wasm::ModuleRunner>.
  depth = 1;
  ModuleRunnerBase<wasm::ModuleRunner>::instantiate
            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_428);
  puVar1 = (wasm->exports).
           super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  this_01 = &interface.instance;
  interface.jsTag.super_IString.str._M_str = (char *)local_428;
  for (puVar4 = (wasm->exports).
                super__Vector_base<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>,_std::allocator<std::unique_ptr<wasm::Export,_std::default_delete<wasm::Export>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    if (((puVar4->_M_t).super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t
         .super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
         super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->kind == Function) {
      poVar3 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] calling ");
      pEVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      name.super_IString.str._M_str = (char *)pEVar2;
      name.super_IString.str._M_len = (size_t)*(char **)((long)&(pEVar2->name).super_IString + 8);
      poVar3 = wasm::operator<<((wasm *)poVar3,*(ostream **)&(pEVar2->name).super_IString,name);
      std::operator<<(poVar3,"\n");
      pEVar2 = (puVar4->_M_t).
               super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
               super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
               super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
      pvVar5 = &pEVar2->value;
      if (*(__index_type *)
           ((long)&(pEVar2->value).super__Variant_base<wasm::Name,_wasm::HeapType> + 0x10) != '\0')
      {
        pvVar5 = (variant<wasm::Name,_wasm::HeapType> *)0x0;
      }
      NVar9.super_IString.str._M_str =
           *(char **)&(pvVar5->super__Variant_base<wasm::Name,_wasm::HeapType>).
                      super__Move_assign_alias<wasm::Name,_wasm::HeapType>;
      NVar9.super_IString.str._M_len = (size_t)wasm;
      func = (Function *)::wasm::Module::getFunction(NVar9);
      run((FunctionResult *)&value.type,this,func,wasm,(ModuleRunner *)local_428);
      this_02 = (_Copy_assign_base<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 *)std::
                   map<wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>,_std::less<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_std::variant<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>_>_>_>
                   ::operator[](&this->results,
                                &((puVar4->_M_t).
                                  super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>
                                  .super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl)->name)
      ;
      std::__detail::__variant::
      _Copy_assign_base<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      ::operator=(this_02,(_Copy_assign_base<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                           *)&value.type);
      if ((ret.
           super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           .
           super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
           ._M_u._M_first._M_storage._M_storage[0x30] == '\0') &&
         ((long)(ret.
                 super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 .
                 super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                 ._M_u._32_8_ -
                ret.
                super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                .
                super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                ._M_u._24_8_) / 0x18 + value.type.id != 0)) {
        poVar3 = std::operator<<((ostream *)&std::cout,"[fuzz-exec] note result: ");
        pEVar2 = (puVar4->_M_t).
                 super___uniq_ptr_impl<wasm::Export,_std::default_delete<wasm::Export>_>._M_t.
                 super__Tuple_impl<0UL,_wasm::Export_*,_std::default_delete<wasm::Export>_>.
                 super__Head_base<0UL,_wasm::Export_*,_false>._M_head_impl;
        name_00.super_IString.str._M_str = (char *)pEVar2;
        name_00.super_IString.str._M_len =
             (size_t)*(char **)((long)&(pEVar2->name).super_IString + 8);
        poVar3 = wasm::operator<<((wasm *)poVar3,*(ostream **)&(pEVar2->name).super_IString,name_00)
        ;
        std::operator<<(poVar3," => ");
        IVar10 = SmallVector<wasm::Literal,_1UL>::end
                           ((SmallVector<wasm::Literal,_1UL> *)&value.type);
        ret.
        super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        .
        super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
        ._56_8_ = IVar10.
                  super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
                  .index;
        lVar7 = -0x18;
        for (lVar8 = 0;
            ret.
            super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
            .
            super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
            .
            super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
            .
            super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
            .
            super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
            .
            super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
            ._56_8_ != lVar8 ||
            IVar10.
            super_IteratorBase<wasm::SmallVector<wasm::Literal,_1UL>,_wasm::SmallVector<wasm::Literal,_1UL>::Iterator>
            .parent != (SmallVector<wasm::Literal,_1UL> *)&value.type; lVar8 = lVar8 + 1) {
          pLVar6 = (Literal *)
                   (ret.
                    super__Variant_base<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                    .
                    super__Move_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                    .
                    super__Copy_assign_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                    .
                    super__Move_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                    .
                    super__Copy_ctor_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                    .
                    super__Variant_storage_alias<wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                    ._M_u._24_8_ + lVar7);
          if (lVar8 == 0) {
            pLVar6 = (Literal *)&ret;
          }
          ::wasm::Literal::Literal((Literal *)local_b0,pLVar6);
          ::wasm::Literal::Literal((Literal *)this_01,(Literal *)local_b0);
          printValue(this,(Literal *)this_01);
          ::wasm::Literal::~Literal((Literal *)this_01);
          ::wasm::Literal::~Literal((Literal *)local_b0);
          lVar7 = lVar7 + 0x18;
        }
      }
      std::__detail::__variant::
      _Variant_storage<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
      ::~_Variant_storage((_Variant_storage<false,_wasm::Literals,_wasm::ExecutionResults::Trap,_wasm::ExecutionResults::Exception>
                           *)&value.type);
    }
  }
  ModuleRunnerBase<wasm::ModuleRunner>::~ModuleRunnerBase
            ((ModuleRunnerBase<wasm::ModuleRunner> *)local_428);
  ShellExternalInterface::~ShellExternalInterface
            ((ShellExternalInterface *)
             &instance.super_ModuleRunnerBase<wasm::ModuleRunner>.linkedInstances._M_t._M_impl.
              super__Rb_tree_header._M_node_count);
  return;
}

Assistant:

void get(Module& wasm) {
    LoggingExternalInterface interface(loggings, wasm);
    try {
      ModuleRunner instance(wasm, &interface);
      // This is not an optimization: we want to execute anything, even relaxed
      // SIMD instructions.
      instance.setRelaxedBehavior(ModuleRunner::RelaxedBehavior::Execute);
      instance.instantiate();
      interface.setModuleRunner(&instance);
      // execute all exported methods (that are therefore preserved through
      // opts)
      for (auto& exp : wasm.exports) {
        if (exp->kind != ExternalKind::Function) {
          continue;
        }
        std::cout << "[fuzz-exec] calling " << exp->name << "\n";
        auto* func = wasm.getFunction(*exp->getInternalName());
        FunctionResult ret = run(func, wasm, instance);
        results[exp->name] = ret;
        if (auto* values = std::get_if<Literals>(&ret)) {
          // ignore the result if we hit an unreachable and returned no value
          if (values->size() > 0) {
            std::cout << "[fuzz-exec] note result: " << exp->name << " => ";
            for (auto value : *values) {
              printValue(value);
            }
          }
        }
      }
    } catch (const TrapException&) {
      // May throw in instance creation (init of offsets).
    } catch (const HostLimitException&) {
      // May throw in instance creation (e.g. array.new of huge size).
      // This should be ignored and not compared with, as optimizations can
      // change whether a host limit is reached.
      ignore = true;
    }
  }